

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall Builder::AddTarget(Builder *this,Node *target,string *err)

{
  bool bVar1;
  reference ppNVar2;
  Edge *this_00;
  Edge *validation_in_edge;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_60;
  iterator n;
  Edge *in_edge;
  undefined1 local_40 [8];
  vector<Node_*,_std::allocator<Node_*>_> validation_nodes;
  string *err_local;
  Node *target_local;
  Builder *this_local;
  
  validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)err;
  std::vector<Node_*,_std::allocator<Node_*>_>::vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)local_40);
  bVar1 = DependencyScan::RecomputeDirty
                    (&this->scan_,target,(vector<Node_*,_std::allocator<Node_*>_> *)local_40,
                     (string *)
                     validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    n._M_current = (Node **)Node::in_edge(target);
    if ((((Edge *)n._M_current != (Edge *)0x0) &&
        (bVar1 = Edge::outputs_ready((Edge *)n._M_current), bVar1)) ||
       (bVar1 = Plan::AddTarget(&this->plan_,target,
                                (string *)
                                validation_nodes.super__Vector_base<Node_*,_std::allocator<Node_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar1)) {
      local_60._M_current =
           (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::begin
                              ((vector<Node_*,_std::allocator<Node_*>_> *)local_40);
      while( true ) {
        validation_in_edge =
             (Edge *)std::vector<Node_*,_std::allocator<Node_*>_>::end
                               ((vector<Node_*,_std::allocator<Node_*>_> *)local_40);
        bVar1 = __gnu_cxx::operator!=
                          (&local_60,
                           (__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>
                            *)&validation_in_edge);
        if (!bVar1) break;
        ppNVar2 = __gnu_cxx::
                  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                  operator*(&local_60);
        this_00 = Node::in_edge(*ppNVar2);
        if ((this_00 != (Edge *)0x0) && (bVar1 = Edge::outputs_ready(this_00), !bVar1)) {
          ppNVar2 = __gnu_cxx::
                    __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
                    operator*(&local_60);
          bVar1 = Plan::AddTarget(&this->plan_,*ppNVar2,
                                  (string *)
                                  validation_nodes.
                                  super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
          if (!bVar1) {
            this_local._7_1_ = false;
            goto LAB_001ef59e;
          }
        }
        __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
        operator++(&local_60);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_001ef59e:
  std::vector<Node_*,_std::allocator<Node_*>_>::~vector
            ((vector<Node_*,_std::allocator<Node_*>_> *)local_40);
  return this_local._7_1_;
}

Assistant:

bool Builder::AddTarget(Node* target, string* err) {
  std::vector<Node*> validation_nodes;
  if (!scan_.RecomputeDirty(target, &validation_nodes, err))
    return false;

  Edge* in_edge = target->in_edge();
  if (!in_edge || !in_edge->outputs_ready()) {
    if (!plan_.AddTarget(target, err)) {
      return false;
    }
  }

  // Also add any validation nodes found during RecomputeDirty as top level
  // targets.
  for (std::vector<Node*>::iterator n = validation_nodes.begin();
       n != validation_nodes.end(); ++n) {
    if (Edge* validation_in_edge = (*n)->in_edge()) {
      if (!validation_in_edge->outputs_ready() &&
          !plan_.AddTarget(*n, err)) {
        return false;
      }
    }
  }

  return true;
}